

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSBuilder::addExports(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Export *pEVar1;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var2;
  size_t sVar3;
  long *plVar4;
  Ref value;
  Ref *pRVar5;
  ostream *poVar6;
  IString *this_00;
  Value *this_01;
  Value *this_02;
  Ref RVar7;
  Value *pVVar8;
  Ref RVar9;
  Ref RVar10;
  undefined1 uVar11;
  uint uVar12;
  char *pcVar13;
  undefined1 auVar14 [8];
  undefined1 *puVar15;
  Ref in_R8;
  pointer puVar16;
  IString key;
  IString op;
  IString key_00;
  IString key_01;
  IString key_02;
  IString key_03;
  IString key_04;
  IString key_05;
  IString key_06;
  IString key_07;
  Name name;
  IString name_00;
  IString IVar17;
  string_view sVar18;
  string_view sVar19;
  undefined1 local_248 [8];
  Ref block;
  ostream local_238 [96];
  ios_base local_1d8 [280];
  long *local_c0;
  long local_b0 [2];
  pointer local_a0;
  string_view local_98;
  Module *local_88;
  Value *local_80;
  pointer local_78;
  char *pcStack_70;
  Ref local_60;
  Ref block_1;
  
  value = cashew::ValueBuilder::makeObject();
  puVar16 = (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (wasm->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_88 = wasm;
  RVar10.inst = ast.inst;
  if (puVar16 != local_a0) {
    do {
      local_80 = RVar10.inst;
      pEVar1 = (puVar16->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      uVar12 = pEVar1->kind + Table;
      if (5 < uVar12) goto switchD_005abf44_default;
      pcVar13 = (char *)((long)&switchD_005abf44::switchdataD_00b3b070 +
                        (long)(int)(&switchD_005abf44::switchdataD_00b3b070)[uVar12]);
      switch(pEVar1->kind) {
      case Function:
        IVar17 = fromName(this,(IString)(pEVar1->name).super_IString,Export);
        local_78 = (pointer)IVar17.str._M_len;
        sVar19 = (string_view)
                 fromName(this,(Name)(((puVar16->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                     value).super_IString.str,Top);
        puVar15 = &DAT_00000018;
        pVVar8 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar8->type = Null;
        cashew::Value::free(pVVar8,puVar15);
        pVVar8->type = String;
        (pVVar8->field_1).str.str = sVar19;
        sVar18._M_str = IVar17.str._M_str;
        sVar18._M_len = (size_t)local_78;
        ast.inst = local_80;
        break;
      case Table:
        sVar18 = (string_view)fromName(this,(IString)(pEVar1->name).super_IString,Export);
        local_78 = FUNCTION_TABLE;
        pcStack_70 = DAT_00da8830;
        puVar15 = &DAT_00000018;
        pVVar8 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar8->type = Null;
        cashew::Value::free(pVVar8,puVar15);
        pVVar8->type = String;
        (pVVar8->field_1).str.str._M_len = (size_t)local_78;
        (pVVar8->field_1).str.str._M_str = pcStack_70;
        break;
      case Memory:
        local_78 = puVar16;
        RVar10 = cashew::ValueBuilder::makeObject();
        uVar11 = SUB81(pcVar13,0);
        RVar7 = cashew::ValueBuilder::makeObject();
        sVar19 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xbaa184),(bool)uVar11);
        key_01.str._M_len = sVar19._M_str;
        key_01.str._M_str = (char *)RVar7.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar10.inst,(Value *)sVar19._M_len,key_01,in_R8);
        _Var2._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
             (((local_88->memories).
               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
        pVVar8 = *(Value **)
                  ((long)_Var2._M_t.
                         super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40);
        if (*(Value **)
             ((long)_Var2._M_t.
                    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) < pVVar8) {
          sVar19 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xba21b5),SUB81(pVVar8,0));
          pcVar13 = DAT_00da8770;
          key_02.str._M_len = sVar19._M_str;
          block_1.inst = WASM_MEMORY_GROW;
          puVar15 = &DAT_00000018;
          pVVar8 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
          pVVar8->type = Null;
          cashew::Value::free(pVVar8,puVar15);
          pVVar8->type = String;
          (pVVar8->field_1).ref.inst = block_1.inst;
          (pVVar8->field_1).str.str._M_str = pcVar13;
          key_02.str._M_str = (char *)pVVar8;
          cashew::ValueBuilder::appendToObjectWithQuotes
                    ((ValueBuilder *)RVar7.inst,(Value *)sVar19._M_len,key_02,in_R8);
        }
        uVar11 = SUB81(pVVar8,0);
        RVar7 = cashew::ValueBuilder::makeObject();
        sVar19 = IString::interned((IString *)0x0,(string_view)ZEXT816(0xbd4a1c),(bool)uVar11);
        name_00.str._M_str = sVar19._M_str;
        name_00.str._M_len = (size_t)name_00.str._M_str;
        local_248 = (undefined1  [8])
                    cashew::ValueBuilder::makeFunction((ValueBuilder *)sVar19._M_len,name_00);
        pRVar5 = cashew::Ref::operator[]((Ref *)local_248,3);
        pcVar13 = DAT_00da85f0;
        pVVar8 = pRVar5->inst;
        block_1.inst = BUFFER;
        puVar15 = &DAT_00000018;
        RVar9.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar9.inst)->type = Null;
        cashew::Value::free(RVar9.inst,puVar15);
        (RVar9.inst)->type = String;
        ((RVar9.inst)->field_1).ref.inst = block_1.inst;
        ((RVar9.inst)->field_1).str.str._M_str = pcVar13;
        RVar9 = cashew::ValueBuilder::makeReturn(RVar9);
        cashew::Value::push_back(pVVar8,RVar9);
        sVar19 = IString::interned((IString *)0x3,(string_view)ZEXT816(0xb9153f),(bool)uVar11);
        key_03.str._M_len = sVar19._M_str;
        key_03.str._M_str = (char *)local_248;
        auVar14 = local_248;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar7.inst,(Value *)sVar19._M_len,key_03,in_R8);
        sVar19 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xbd3a4e),SUB81(auVar14,0));
        key_04.str._M_len = sVar19._M_str;
        key_04.str._M_str = (char *)RVar7.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)RVar10.inst,(Value *)sVar19._M_len,key_04,in_R8);
        sVar19 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xbc768e),SUB81(RVar7.inst,0)
                                  );
        puVar15 = &DAT_00000018;
        block_1.inst = RVar10.inst;
        pVVar8 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar8->type = Null;
        cashew::Value::free(pVVar8,puVar15);
        pVVar8->type = String;
        (pVVar8->field_1).str.str = sVar19;
        sVar19 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xb3d402),SUB81(RVar7.inst,0)
                                  );
        key_05.str._M_len = sVar19._M_str;
        key_05.str._M_str = (char *)RVar7.inst;
        RVar10 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar8,(Value *)sVar19._M_len,key_05)
        ;
        sVar19 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xbc768e),SUB81(RVar7.inst,0)
                                  );
        puVar15 = &DAT_00000018;
        pVVar8 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        pVVar8->type = Null;
        cashew::Value::free(pVVar8,puVar15);
        pVVar8->type = String;
        (pVVar8->field_1).str.str = sVar19;
        sVar19 = IString::interned((IString *)&DAT_00000009,(string_view)ZEXT816(0xb3d409),
                                   SUB81(RVar7.inst,0));
        key_06.str._M_len = sVar19._M_str;
        key_06.str._M_str = (char *)RVar7.inst;
        RVar7 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar8,(Value *)sVar19._M_len,key_06);
        RVar10 = cashew::ValueBuilder::makeCall(RVar10,RVar7);
        cashew::ValueBuilder::appendToCall(RVar10,block_1);
        puVar16 = local_78;
        sVar19 = (string_view)
                 fromName(this,(IString)(((local_78->_M_t).
                                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                          .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                         )->name).super_IString,Export);
        goto LAB_005ac591;
      case Global:
        block_1 = cashew::ValueBuilder::makeObject();
        uVar11 = 1;
        sVar18 = (string_view)
                 fromName(this,(Name)(((puVar16->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->
                                     value).super_IString.str,Top);
        local_248 = (undefined1  [8])cashew::ValueBuilder::makeBlock();
        pRVar5 = cashew::Ref::operator[]((Ref *)local_248,1);
        pVVar8 = pRVar5->inst;
        puVar15 = &DAT_00000018;
        RVar10.inst = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        (RVar10.inst)->type = Null;
        cashew::Value::free(RVar10.inst,puVar15);
        (RVar10.inst)->type = String;
        ((RVar10.inst)->field_1).str.str = sVar18;
        RVar10 = cashew::ValueBuilder::makeReturn(RVar10);
        cashew::Value::push_back(pVVar8,RVar10);
        sVar19 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xba21b5),(bool)uVar11);
        key.str._M_len = sVar19._M_str;
        key.str._M_str = (char *)local_248;
        auVar14 = local_248;
        cashew::ValueBuilder::appendToObjectAsGetter
                  ((ValueBuilder *)block_1.inst,(Value *)sVar19._M_len,key,in_R8);
        uVar11 = SUB81(auVar14,0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
        local_60.inst._0_1_ = 0x5f;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_248,(char *)&local_60,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,sVar18._M_str,sVar18._M_len);
        std::__cxx11::stringbuf::str();
        plVar4 = local_c0;
        local_78 = puVar16;
        this_00 = (IString *)strlen((char *)local_c0);
        sVar19._M_str = (char *)0x0;
        sVar19._M_len = (size_t)plVar4;
        local_98 = IString::interned(this_00,sVar19,(bool)uVar11);
        if (local_c0 != local_b0) {
          operator_delete(local_c0,local_b0[0] + 1);
        }
        local_60 = cashew::ValueBuilder::makeBlock();
        pRVar5 = cashew::Ref::operator[](&local_60,1);
        pVVar8 = pRVar5->inst;
        puVar15 = &DAT_00000018;
        this_01 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        this_01->type = Null;
        cashew::Value::free(this_01,puVar15);
        this_01->type = String;
        (this_01->field_1).str.str = sVar18;
        sVar3 = DAT_00da8ed0;
        RVar10.inst = cashew::SET.inst;
        puVar15 = &DAT_00000018;
        this_02 = (Value *)MixedArena::allocSpace((MixedArena *)cashew::arena,0x18,8);
        this_02->type = Null;
        cashew::Value::free(this_02,puVar15);
        this_02->type = String;
        (this_02->field_1).str.str._M_len = local_98._M_len;
        (this_02->field_1).str.str._M_str = local_98._M_str;
        op.str._M_str = (char *)this_02;
        op.str._M_len = sVar3;
        RVar10 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_01,RVar10,op,in_R8);
        uVar11 = SUB81(this_02,0);
        cashew::Value::push_back(pVVar8,RVar10);
        sVar19 = IString::interned((IString *)0x5,(string_view)ZEXT816(0xba21b5),(bool)uVar11);
        in_R8.inst = (Value *)local_98._M_str;
        cashew::ValueBuilder::appendToObjectAsSetter
                  (block_1,(IString)sVar19,(IString)local_98,local_60);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
        std::ios_base::~ios_base(local_1d8);
        puVar16 = local_78;
        sVar19 = (string_view)
                 fromName(this,(IString)(((local_78->_M_t).
                                          super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                          .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                         )->name).super_IString,Export);
        RVar10 = block_1;
LAB_005ac591:
        key_07.str._M_len = sVar19._M_str;
        key_07.str._M_str = (char *)RVar10.inst;
        cashew::ValueBuilder::appendToObjectWithQuotes
                  ((ValueBuilder *)value.inst,(Value *)sVar19._M_len,key_07,in_R8);
        ast.inst = local_80;
        goto switchD_005abf44_default;
      default:
        Fatal::Fatal((Fatal *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_238,"unsupported export type: ",0x19);
        pEVar1 = (puVar16->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        name.super_IString.str._M_str = pcVar13;
        name.super_IString.str._M_len = (size_t)*(char **)((long)&(pEVar1->name).super_IString + 8);
        wasm::operator<<((wasm *)local_238,*(ostream **)&(pEVar1->name).super_IString,name);
        Fatal::operator<<((Fatal *)local_248,(char (*) [2])0xba6bdf);
        Fatal::~Fatal((Fatal *)local_248);
      }
      key_00.str._M_len = sVar18._M_str;
      key_00.str._M_str = (char *)pVVar8;
      cashew::ValueBuilder::appendToObjectWithQuotes
                ((ValueBuilder *)value.inst,(Value *)sVar18._M_len,key_00,in_R8);
switchD_005abf44_default:
      puVar16 = puVar16 + 1;
      RVar10.inst = local_80;
    } while (puVar16 != local_a0);
  }
  if ((local_88->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_88->memories).
      super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    addMemoryFuncs(this,ast,local_88);
  }
  RVar10 = cashew::ValueBuilder::makeReturn(value);
  cashew::Value::push_back(ast.inst,RVar10);
  return;
}

Assistant:

void Wasm2JSBuilder::addExports(Ref ast, Module* wasm) {
  Ref exports = ValueBuilder::makeObject();
  for (auto& export_ : wasm->exports) {
    switch (export_->kind) {
      case ExternalKind::Function: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(fromName(export_->value, NameScope::Top)));
        break;
      }
      case ExternalKind::Memory: {
        Ref descs = ValueBuilder::makeObject();
        Ref growDesc = ValueBuilder::makeObject();
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("grow"), growDesc);
        if (wasm->memories[0]->max > wasm->memories[0]->initial) {
          ValueBuilder::appendToObjectWithQuotes(
            growDesc,
            IString("value"),
            ValueBuilder::makeName(WASM_MEMORY_GROW));
        }
        Ref bufferDesc = ValueBuilder::makeObject();
        Ref bufferGetter = ValueBuilder::makeFunction(IString(""));
        bufferGetter[3]->push_back(
          ValueBuilder::makeReturn(ValueBuilder::makeName(BUFFER)));
        ValueBuilder::appendToObjectWithQuotes(
          bufferDesc, IString("get"), bufferGetter);
        ValueBuilder::appendToObjectWithQuotes(
          descs, IString("buffer"), bufferDesc);
        Ref memory = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("create")),
          ValueBuilder::makeDot(ValueBuilder::makeName(IString("Object")),
                                IString("prototype")));
        ValueBuilder::appendToCall(memory, descs);
        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), memory);
        break;
      }
      case ExternalKind::Table: {
        ValueBuilder::appendToObjectWithQuotes(
          exports,
          fromName(export_->name, NameScope::Export),
          ValueBuilder::makeName(FUNCTION_TABLE));
        break;
      }
      case ExternalKind::Global: {
        Ref object = ValueBuilder::makeObject();

        IString identName = fromName(export_->value, NameScope::Top);

        // getter
        {
          Ref block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeReturn(ValueBuilder::makeName(identName)));

          ValueBuilder::appendToObjectAsGetter(object, IString("value"), block);
        }

        // setter
        {
          std::ostringstream buffer;
          buffer << '_' << identName;
          auto setterParam = stringToIString(buffer.str());

          auto block = ValueBuilder::makeBlock();

          block[1]->push_back(
            ValueBuilder::makeBinary(ValueBuilder::makeName(identName),
                                     SET,
                                     ValueBuilder::makeName(setterParam)));

          ValueBuilder::appendToObjectAsSetter(
            object, IString("value"), setterParam, block);
        }

        ValueBuilder::appendToObjectWithQuotes(
          exports, fromName(export_->name, NameScope::Export), object);

        break;
      }
      case ExternalKind::Tag:
      case ExternalKind::Invalid:
        Fatal() << "unsupported export type: " << export_->name << "\n";
    }
  }
  if (!wasm->memories.empty()) {
    addMemoryFuncs(ast, wasm);
  }
  ast->push_back(
    ValueBuilder::makeStatement(ValueBuilder::makeReturn(exports)));
}